

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O3

void __thiscall UEFITool::readSettings(UEFITool *this)

{
  undefined8 uVar1;
  PrivateShared *pPVar2;
  bool bVar3;
  undefined4 uVar4;
  int iVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QSettings settings;
  QList<int> horList;
  QList<int> vertList;
  QArrayData *local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  anon_union_24_3_e3d07ef4_for_data local_128;
  undefined8 local_110;
  anon_union_24_3_e3d07ef4_for_data local_108;
  undefined1 local_e8 [24];
  undefined8 uStack_d0;
  qsizetype local_c8;
  QArrayData *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  QPodArrayOps<int> local_98;
  QArrayData *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  QSettings::QSettings((QSettings *)local_e8,(QObject *)this);
  QVar6.m_data = (storage_type *)0x13;
  QVar6.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar6);
  local_e8._16_8_ = local_128.shared;
  uStack_d0 = local_128._8_8_;
  local_c8 = local_128._16_8_;
  local_128.shared = (PrivateShared *)0x0;
  local_128._8_8_ = 0;
  local_128._16_8_ = 0;
  local_110 = 2;
  QSettings::value((QString *)local_108.data,(QVariant *)local_e8);
  QVariant::toByteArray();
  QWidget::restoreGeometry((QByteArray *)this);
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148,1,8);
    }
  }
  QVariant::~QVariant((QVariant *)&local_108);
  QVariant::~QVariant((QVariant *)&local_128);
  if ((QArrayData *)local_e8._16_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_e8._16_8_ = *(int *)local_e8._16_8_ + -1;
    UNLOCK();
    if (*(int *)local_e8._16_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_e8._16_8_,2,8);
    }
  }
  QVar7.m_data = (storage_type *)0x16;
  QVar7.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar7);
  local_e8._16_8_ = local_128.shared;
  uStack_d0 = local_128._8_8_;
  local_c8 = local_128._16_8_;
  local_128.shared = (PrivateShared *)0x0;
  local_128._8_8_ = 0;
  local_128._16_8_ = 0;
  local_110 = 2;
  QSettings::value((QString *)local_108.data,(QVariant *)local_e8);
  QVariant::toByteArray();
  QMainWindow::restoreState((QByteArray *)this,(int)&local_148);
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148,1,8);
    }
  }
  QVariant::~QVariant((QVariant *)&local_108);
  QVariant::~QVariant((QVariant *)&local_128);
  if ((QArrayData *)local_e8._16_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_e8._16_8_ = *(int *)local_e8._16_8_ + -1;
    UNLOCK();
    if (*(int *)local_e8._16_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_e8._16_8_,2,8);
    }
  }
  local_c8 = 0;
  local_e8._16_8_ = (QArrayData *)0x0;
  uStack_d0 = 0;
  local_98.super_QArrayDataPointer<int>.size = 0;
  local_98.super_QArrayDataPointer<int>.d = (Data *)0x0;
  local_98.super_QArrayDataPointer<int>.ptr = (int *)0x0;
  QVar8.m_data = (storage_type *)0x14;
  QVar8.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar8);
  local_148 = (QArrayData *)local_128.shared;
  uStack_140 = local_128._8_8_;
  local_138 = local_128._16_8_;
  QVariant::QVariant((QVariant *)&local_128,600);
  QSettings::value((QString *)local_108.data,(QVariant *)local_e8);
  uVar4 = QVariant::toInt((bool *)local_108.data);
  local_b8 = (QArrayData *)CONCAT44(local_b8._4_4_,uVar4);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)(local_e8 + 0x10),local_c8,(int *)&local_b8);
  QVariant::~QVariant((QVariant *)&local_108);
  QVariant::~QVariant((QVariant *)&local_128);
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148,2,8);
    }
  }
  QVar9.m_data = (storage_type *)0x14;
  QVar9.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar9);
  local_148 = (QArrayData *)local_128.shared;
  uStack_140 = local_128._8_8_;
  local_138 = local_128._16_8_;
  QVariant::QVariant((QVariant *)&local_128,0xb4);
  QSettings::value((QString *)local_108.data,(QVariant *)local_e8);
  uVar4 = QVariant::toInt((bool *)local_108.data);
  local_b8 = (QArrayData *)CONCAT44(local_b8._4_4_,uVar4);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)(local_e8 + 0x10),local_c8,(int *)&local_b8);
  QVariant::~QVariant((QVariant *)&local_108);
  QVariant::~QVariant((QVariant *)&local_128);
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148,2,8);
    }
  }
  QVar10.m_data = (storage_type *)0x15;
  QVar10.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar10);
  local_148 = (QArrayData *)local_128.shared;
  uStack_140 = local_128._8_8_;
  local_138 = local_128._16_8_;
  QVariant::QVariant((QVariant *)&local_128,400);
  QSettings::value((QString *)local_108.data,(QVariant *)local_e8);
  uVar4 = QVariant::toInt((bool *)local_108.data);
  local_b8 = (QArrayData *)CONCAT44(local_b8._4_4_,uVar4);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            (&local_98,local_98.super_QArrayDataPointer<int>.size,(int *)&local_b8);
  QVariant::~QVariant((QVariant *)&local_108);
  QVariant::~QVariant((QVariant *)&local_128);
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148,2,8);
    }
  }
  QVar11.m_data = (storage_type *)0x18;
  QVar11.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar11);
  local_148 = (QArrayData *)local_128.shared;
  uStack_140 = local_128._8_8_;
  local_138 = local_128._16_8_;
  QVariant::QVariant((QVariant *)&local_128,0xb4);
  QSettings::value((QString *)local_108.data,(QVariant *)local_e8);
  uVar4 = QVariant::toInt((bool *)local_108.data);
  local_b8 = (QArrayData *)CONCAT44(local_b8._4_4_,uVar4);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            (&local_98,local_98.super_QArrayDataPointer<int>.size,(int *)&local_b8);
  QVariant::~QVariant((QVariant *)&local_108);
  QVariant::~QVariant((QVariant *)&local_128);
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148,2,8);
    }
  }
  QSplitter::setSizes(*(QList **)(this->ui + 0x118));
  QSplitter::setSizes(*(QList **)(this->ui + 0x110));
  uVar1 = *(undefined8 *)(this->ui + 0x130);
  QVar12.m_data = (storage_type *)0x11;
  QVar12.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar12);
  local_148 = (QArrayData *)local_128.shared;
  uStack_140 = local_128._8_8_;
  local_138 = local_128._16_8_;
  iVar5 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant((QVariant *)&local_128,iVar5);
  QSettings::value((QString *)local_108.data,(QVariant *)local_e8);
  QVariant::toInt((bool *)local_108.data);
  QTreeView::setColumnWidth((int)uVar1,0);
  QVariant::~QVariant((QVariant *)&local_108);
  QVariant::~QVariant((QVariant *)&local_128);
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148,2,8);
    }
  }
  uVar1 = *(undefined8 *)(this->ui + 0x130);
  QVar13.m_data = (storage_type *)0x11;
  QVar13.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar13);
  local_148 = (QArrayData *)local_128.shared;
  uStack_140 = local_128._8_8_;
  local_138 = local_128._16_8_;
  iVar5 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant((QVariant *)&local_128,iVar5);
  QSettings::value((QString *)local_108.data,(QVariant *)local_e8);
  QVariant::toInt((bool *)local_108.data);
  QTreeView::setColumnWidth((int)uVar1,1);
  QVariant::~QVariant((QVariant *)&local_108);
  QVariant::~QVariant((QVariant *)&local_128);
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148,2,8);
    }
  }
  uVar1 = *(undefined8 *)(this->ui + 0x130);
  QVar14.m_data = (storage_type *)0x11;
  QVar14.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar14);
  local_148 = (QArrayData *)local_128.shared;
  uStack_140 = local_128._8_8_;
  local_138 = local_128._16_8_;
  iVar5 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant((QVariant *)&local_128,iVar5);
  QSettings::value((QString *)local_108.data,(QVariant *)local_e8);
  QVariant::toInt((bool *)local_108.data);
  QTreeView::setColumnWidth((int)uVar1,2);
  QVariant::~QVariant((QVariant *)&local_108);
  QVariant::~QVariant((QVariant *)&local_128);
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148,2,8);
    }
  }
  uVar1 = *(undefined8 *)(this->ui + 0x130);
  QVar15.m_data = (storage_type *)0x11;
  QVar15.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar15);
  local_148 = (QArrayData *)local_128.shared;
  uStack_140 = local_128._8_8_;
  local_138 = local_128._16_8_;
  iVar5 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant((QVariant *)&local_128,iVar5);
  QSettings::value((QString *)local_108.data,(QVariant *)local_e8);
  QVariant::toInt((bool *)local_108.data);
  QTreeView::setColumnWidth((int)uVar1,3);
  QVariant::~QVariant((QVariant *)&local_108);
  QVariant::~QVariant((QVariant *)&local_128);
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148,2,8);
    }
  }
  QVar16.m_data = (storage_type *)0x13;
  QVar16.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar16);
  local_148 = (QArrayData *)local_128.shared;
  uStack_140 = local_128._8_8_;
  local_138 = local_128._16_8_;
  QVariant::QVariant((QVariant *)&local_128,true);
  QSettings::value((QString *)local_108.data,(QVariant *)local_e8);
  bVar3 = (bool)QVariant::toBool();
  this->markingEnabled = bVar3;
  QVariant::~QVariant((QVariant *)&local_108);
  QVariant::~QVariant((QVariant *)&local_128);
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148,2,8);
    }
  }
  QAction::setChecked(SUB81(*(undefined8 *)(this->ui + 0xd8),0));
  local_b8 = (QArrayData *)0x0;
  uStack_b0 = 0;
  local_a8 = 0;
  QVar17.m_data = (storage_type *)0x13;
  QVar17.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar17);
  local_78 = (QArrayData *)local_128.shared;
  uStack_70 = local_128._8_8_;
  local_68 = local_128._16_8_;
  QVar18.m_data = (storage_type *)0xb;
  QVar18.m_size = (qsizetype)&local_148;
  QString::fromUtf8(QVar18);
  local_58 = local_148;
  uStack_50 = uStack_140;
  local_48 = local_138;
  QVariant::QVariant((QVariant *)&local_128,(QString *)&local_58);
  QSettings::value((QString *)local_108.data,(QVariant *)local_e8);
  QVariant::toString();
  uStack_b0 = uStack_30;
  local_b8 = local_38;
  local_38 = (QArrayData *)0x0;
  uStack_30 = 0;
  local_a8 = local_28;
  local_28 = 0;
  QVariant::~QVariant((QVariant *)&local_108);
  QVariant::~QVariant((QVariant *)&local_128);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,8);
    }
  }
  QVar19.m_data = (storage_type *)0x13;
  QVar19.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar19);
  local_148 = (QArrayData *)local_128.shared;
  uStack_140 = local_128._8_8_;
  local_138 = local_128._16_8_;
  QVariant::QVariant((QVariant *)&local_128,10);
  QSettings::value((QString *)local_108.data,(QVariant *)local_e8);
  iVar5 = QVariant::toInt((bool *)local_108.data);
  QVariant::~QVariant((QVariant *)&local_108);
  QVariant::~QVariant((QVariant *)&local_128);
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148,2,8);
    }
  }
  QFont::QFont((QFont *)local_108.data,(QString *)&local_b8,iVar5,-1,false);
  pPVar2 = *(PrivateShared **)&this->currentFont;
  *(PrivateShared **)&this->currentFont = local_108.shared;
  uVar4 = *(undefined4 *)&this->field_0xd8;
  *(undefined4 *)&this->field_0xd8 = local_108._8_4_;
  local_108.shared = pPVar2;
  local_108._8_4_ = uVar4;
  QFont::~QFont((QFont *)local_108.data);
  QFont::setStyleHint(&this->currentFont,7,1);
  QApplication::setFont(&this->currentFont,(char *)0x0);
  if (local_b8 != (QArrayData *)0x0) {
    LOCK();
    (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b8,2,8);
    }
  }
  if (&(local_98.super_QArrayDataPointer<int>.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.super_QArrayDataPointer<int>.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_98.super_QArrayDataPointer<int>.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.super_QArrayDataPointer<int>.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.super_QArrayDataPointer<int>.d)->super_QArrayData,4,8);
    }
  }
  if ((QArrayData *)local_e8._16_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_e8._16_8_ = *(int *)local_e8._16_8_ + -1;
    UNLOCK();
    if (*(int *)local_e8._16_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_e8._16_8_,4,8);
    }
  }
  QSettings::~QSettings((QSettings *)local_e8);
  return;
}

Assistant:

void UEFITool::readSettings()
{
    QSettings settings(this);
    restoreGeometry(settings.value("mainWindow/geometry").toByteArray());
    restoreState(settings.value("mainWindow/windowState").toByteArray());
    QList<int> horList, vertList;
    horList.append(settings.value("mainWindow/treeWidth", 600).toInt());
    horList.append(settings.value("mainWindow/infoWidth", 180).toInt());
    vertList.append(settings.value("mainWindow/treeHeight", 400).toInt());
    vertList.append(settings.value("mainWindow/messageHeight", 180).toInt());
    ui->infoSplitter->setSizes(horList);
    ui->messagesSplitter->setSizes(vertList);
    ui->structureTreeView->setColumnWidth(0, settings.value("tree/columnWidth0", ui->structureTreeView->columnWidth(0)).toInt());
    ui->structureTreeView->setColumnWidth(1, settings.value("tree/columnWidth1", ui->structureTreeView->columnWidth(1)).toInt());
    ui->structureTreeView->setColumnWidth(2, settings.value("tree/columnWidth2", ui->structureTreeView->columnWidth(2)).toInt());
    ui->structureTreeView->setColumnWidth(3, settings.value("tree/columnWidth3", ui->structureTreeView->columnWidth(3)).toInt());
    markingEnabled = settings.value("tree/markingEnabled", true).toBool();
    ui->actionToggleBootGuardMarking->setChecked(markingEnabled);
    
    // Set monospace font
    QString fontName;
    int fontSize;
#if defined Q_OS_MACOS
    fontName = settings.value("mainWindow/fontName", QString("Menlo")).toString();
    fontSize = settings.value("mainWindow/fontSize", 10).toInt();
#elif defined Q_OS_WIN
    fontName = settings.value("mainWindow/fontName", QString("Consolas")).toString();
    fontSize = settings.value("mainWindow/fontSize", 9).toInt();
#else
    fontName = settings.value("mainWindow/fontName", QString("Courier New")).toString();
    fontSize = settings.value("mainWindow/fontSize", 10).toInt();
#endif
    currentFont = QFont(fontName, fontSize);
    currentFont.setStyleHint(QFont::Monospace);
    QApplication::setFont(currentFont);
}